

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

invalid_param_spec * __thiscall
boost::runtime::specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
::operator<<(invalid_param_spec *__return_storage_ptr__,
            specific_param_error<boost::runtime::invalid_param_spec,_boost::runtime::init_error>
            *this,char *val)

{
  std::__cxx11::string::append((char *)&(this->super_init_error).super_param_error.msg);
  invalid_param_spec::invalid_param_spec(__return_storage_ptr__,(invalid_param_spec *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }